

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deRandom.hpp
# Opt level: O3

ValueEntry * __thiscall
de::Random::
chooseWeighted<rsg::ValueEntry_const*,__gnu_cxx::__normal_iterator<rsg::ValueEntry_const**,std::vector<rsg::ValueEntry_const*,std::allocator<rsg::ValueEntry_const*>>>,__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>>
          (Random *this,
          __normal_iterator<const_rsg::ValueEntry_**,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>
          first,__normal_iterator<const_rsg::ValueEntry_**,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>
                last,__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> weight)

{
  int iVar1;
  __normal_iterator<const_rsg::ValueEntry_**,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>
  _Var2;
  __normal_iterator<const_rsg::ValueEntry_**,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>
  _Var3;
  long lVar4;
  __normal_iterator<const_rsg::ValueEntry_**,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>
  _Var5;
  float fVar6;
  float fVar7;
  float fVar8;
  
  _Var3._M_current = last._M_current;
  if (first._M_current == last._M_current) {
    deRandom_getFloat(&this->m_rnd);
  }
  else {
    fVar6 = 0.0;
    iVar1 = 1;
    lVar4 = 0;
    do {
      fVar6 = fVar6 + weight._M_current[lVar4];
      lVar4 = (long)iVar1;
      iVar1 = iVar1 + 1;
    } while (first._M_current + lVar4 != last._M_current);
    fVar7 = deRandom_getFloat(&this->m_rnd);
    if (first._M_current != last._M_current) {
      iVar1 = 1;
      lVar4 = 0;
      fVar8 = 0.0;
      _Var2._M_current = last._M_current;
      _Var5._M_current = first._M_current;
      do {
        fVar8 = fVar8 + weight._M_current[lVar4];
        _Var3._M_current = _Var5._M_current;
        if (fVar6 * fVar7 + 0.0 < fVar8) break;
        if (0.0 < weight._M_current[lVar4]) {
          _Var2._M_current = _Var5._M_current;
        }
        lVar4 = (long)iVar1;
        _Var5._M_current = first._M_current + lVar4;
        iVar1 = iVar1 + 1;
        _Var3._M_current = _Var2._M_current;
      } while (_Var5._M_current != last._M_current);
    }
  }
  return *_Var3._M_current;
}

Assistant:

T Random::chooseWeighted (InputIter first, InputIter last, WeightIter weight)
{
	// Compute weight sum
	float	weightSum	= 0.0f;
	int		ndx;
	for (ndx = 0; (first + ndx) != last; ndx++)
		weightSum += *(weight + ndx);

	// Random point in 0..weightSum
	float p = getFloat(0.0f, weightSum);

	// Find item in range
	InputIter	lastNonZero	= last;
	float		curWeight	= 0.0f;
	for (ndx = 0; (first + ndx) != last; ndx++)
	{
		float w = *(weight + ndx);

		curWeight += w;

		if (p < curWeight)
			return *(first + ndx);
		else if (w > 0.0f)
			lastNonZero = first + ndx;
	}

	DE_ASSERT(lastNonZero != last);
	return *lastNonZero;
}